

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

int BN_bn2lebinpad(BIGNUM *a,uchar *to,int tolen)

{
  int iVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = a->top;
  if ((long)iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar4 = (iVar1 + -1) * 0x40;
    iVar1 = BN_num_bits_word(a->d[(long)iVar1 + -1]);
    iVar3 = iVar1 + iVar4 + 7;
    iVar1 = iVar4 + iVar1 + 0xe;
    if (-1 < iVar3) {
      iVar1 = iVar3;
    }
    iVar1 = iVar1 >> 3;
  }
  iVar3 = -1;
  if (iVar1 <= tolen) {
    if (tolen - iVar1 != 0 && iVar1 <= tolen) {
      memset(to + iVar1,0,(long)(tolen - iVar1));
    }
    iVar3 = tolen;
    if (iVar1 != 0) {
      puVar2 = to + iVar1;
      do {
        iVar4 = iVar1 + -1;
        puVar2 = puVar2 + -1;
        iVar1 = iVar1 + 6;
        if (-1 < iVar4) {
          iVar1 = iVar4;
        }
        *puVar2 = (uchar)(a->d[iVar1 >> 3] >> (((char)iVar4 - ((byte)iVar1 & 0xf8)) * '\b' & 0x3f));
        iVar1 = iVar4;
      } while (iVar4 != 0);
    }
  }
  return iVar3;
}

Assistant:

int BN_bn2lebinpad(const BIGNUM *a, unsigned char *to, int tolen)
{
    int i;
    BN_ULONG l;
    bn_check_top(a);
    i = BN_num_bytes(a);
    if (tolen < i)
        return -1;
    /* Add trailing zeroes if necessary */
    if (tolen > i)
        memset(to + i, 0, tolen - i);
    to += i;
    while (i--) {
        l = a->d[i / BN_BYTES];
        to--;
        *to = (unsigned char)(l >> (8 * (i % BN_BYTES))) & 0xff;
    }
    return tolen;
}